

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

int __thiscall Node::CheckCaseLabel(Node *this)

{
  int iVar1;
  VARTYPE VVar2;
  
  while( true ) {
    while (iVar1 = this->Type, iVar1 < 0x1dd) {
      if (iVar1 == 0x112) {
        iVar1 = CheckCaseLabel(this->Tree[0]);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else if (iVar1 != 0x18a) goto LAB_0011d1ec;
      this = this->Block[0];
      if (this == (Node *)0x0) {
        return 0;
      }
    }
    if (iVar1 != 0x1f5) break;
    iVar1 = CheckCaseLabel(this->Tree[0]);
    if (iVar1 != 0) {
      return 1;
    }
    this = this->Tree[1];
  }
  if (iVar1 - 0x1ddU < 5) {
    return 1;
  }
  if (iVar1 == 0x202) {
    return 0;
  }
LAB_0011d1ec:
  VVar2 = GetNodeVarType(this);
  return (uint)(VVar2 != VARTYPE_INTEGER);
}

Assistant:

int Node::CheckCaseLabel(void)
{
	//
	// Handle this if it is a list
	//
	switch (Type)
	{
	case BAS_S_REMARK:
		if (Block[0])
		{
			return Block[0]->CheckCaseLabel();
		}
		return 0;

	case BAS_S_CASE:

		if (Tree[0]->CheckCaseLabel())
		{
			return 1;
		}
		if (Block[0])
		{
			return Block[0]->CheckCaseLabel();
		}
		return 0;

	case BAS_N_CASEELSE:

		return 0;

	case BAS_N_LIST:

		if (Tree[0]->CheckCaseLabel())
		{
			return 1;
		}
		return Tree[1]->CheckCaseLabel();

	case BAS_X_UNARYLT:
	case BAS_X_UNARYLE:
	case BAS_X_UNARYGT:
	case BAS_X_UNARYGE:
	case BAS_X_UNARYNEQ:
		return 1;
	}

	int ThisType = GetNodeVarType();
	switch (ThisType)
	{
	case VARTYPE_INTEGER:
		return 0;
	default:
		return 1;
	}
}